

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  char *pcVar1;
  Fts3PhraseToken *pFVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  char **ppcVar6;
  int i;
  size_t __n;
  char *a2;
  Fts3MultiSegReader *pCsr;
  long lVar7;
  int nNew;
  char *aNew;
  Fts3SegFilter filter;
  int local_134;
  Fts3PhraseToken *local_130;
  Fts3MultiSegReader *local_128;
  char *local_120;
  int *local_118;
  char **local_110;
  char *local_108;
  long local_100 [14];
  char *pcStack_90;
  undefined8 local_88;
  int local_4c;
  Fts3SegFilter local_48;
  
  pCsr = pTok->pSegcsr;
  local_110 = ppOut;
  memset(&local_108,0,0xc0);
  local_48.flags =
       (uint)(pTok->bFirst != 0) * 0x20 + (uint)(pTok->isPrefix != 0) * 8 + 3 +
       (uint)(iColumn < p->nColumn) * 4;
  local_48.zTerm = pTok->z;
  local_48.nTerm = pTok->n;
  pCsr->pFilter = &local_48;
  local_48.iCol = iColumn;
  iVar3 = fts3SegReaderStart(p,pCsr,local_48.zTerm,local_48.nTerm);
  pFVar2 = pTok;
  piVar5 = pnOut;
  if (iVar3 == 0) {
LAB_001be042:
    local_118 = piVar5;
    local_128 = pCsr;
    local_130 = pFVar2;
    pCsr = local_128;
    iVar3 = sqlite3Fts3SegReaderStep(p,local_128);
    if (iVar3 == 100) {
      pcVar1 = pCsr->aDoclist;
      iVar3 = pCsr->nDoclist;
      if (local_108 == (char *)0x0) {
        pcVar4 = (char *)sqlite3_malloc(iVar3 + 0xb);
        local_108 = pcVar4;
        local_88._0_4_ = iVar3;
        if (pcVar4 == (char *)0x0) {
          iVar3 = 7;
          pCsr = local_128;
          goto LAB_001be17d;
        }
        __n = (size_t)iVar3;
        memcpy(pcVar4,pcVar1,__n);
        pcVar1 = pcVar4 + __n;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        (pcVar4 + __n + 8)[0] = '\0';
        (pcVar4 + __n + 8)[1] = '\0';
        pFVar2 = local_130;
        pCsr = local_128;
        piVar5 = local_118;
      }
      else {
        lVar7 = -0x1e;
        pcVar4 = pcVar1;
        a2 = local_108;
        do {
          iVar3 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar4,iVar3,a2,
                                     *(int *)((long)&local_4c + lVar7 * 2),&local_120,&local_134);
          if (iVar3 != 0) {
            pCsr = local_128;
            pTok = local_130;
            if (pcVar4 == pcVar1) goto LAB_001be17d;
            goto LAB_001be170;
          }
          if (pcVar4 != pcVar1) {
            sqlite3_free(pcVar4);
          }
          sqlite3_free(a2);
          *(undefined8 *)((long)&pcStack_90 + lVar7 * 4) = 0;
          pTok = local_130;
          pFVar2 = local_130;
          piVar5 = local_118;
          if (lVar7 == 0) {
            pcStack_90 = local_120;
            local_4c = local_134;
            pCsr = local_128;
            goto LAB_001be042;
          }
          a2 = *(char **)((long)&local_88 + lVar7 * 4);
          lVar7 = lVar7 + 2;
          pcVar4 = local_120;
          iVar3 = local_134;
        } while (a2 != (char *)0x0);
        *(char **)((long)&pcStack_90 + lVar7 * 4) = local_120;
        *(int *)((long)&local_4c + lVar7 * 2) = local_134;
        pCsr = local_128;
      }
      goto LAB_001be042;
    }
    if (iVar3 == 0) {
      lVar7 = 0;
      pcVar4 = (char *)0x0;
      iVar3 = 0;
      piVar5 = local_118;
      ppcVar6 = local_110;
      do {
        pcVar1 = (&local_108)[lVar7];
        if (pcVar1 != (char *)0x0) {
          if (pcVar4 == (char *)0x0) {
            iVar3 = *(int *)((long)&local_88 + lVar7 * 4);
            (&local_108)[lVar7] = (char *)0x0;
            pcVar4 = pcVar1;
          }
          else {
            iVar3 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar1,
                                       *(int *)((long)&local_88 + lVar7 * 4),pcVar4,iVar3,&local_120
                                       ,&local_134);
            if (iVar3 != 0) goto LAB_001be170;
            sqlite3_free((&local_108)[lVar7]);
            sqlite3_free(pcVar4);
            (&local_108)[lVar7] = (char *)0x0;
            piVar5 = local_118;
            ppcVar6 = local_110;
            pcVar4 = local_120;
            iVar3 = local_134;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      *ppcVar6 = pcVar4;
      *piVar5 = iVar3;
      iVar3 = 0;
      pTok = local_130;
      goto LAB_001be192;
    }
  }
  goto LAB_001be17d;
LAB_001be170:
  sqlite3_free(pcVar4);
  pTok = local_130;
LAB_001be17d:
  lVar7 = 0;
  do {
    sqlite3_free((&local_108)[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
LAB_001be192:
  sqlite3Fts3SegReaderFinish(pCsr);
  sqlite3_free(pCsr);
  pTok->pSegcsr = (Fts3MultiSegReader *)0x0;
  return iVar3;
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr)) 
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}